

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O1

void Nwk_NodeUpdateRequired(Nwk_Obj_t *pObj)

{
  Tim_Man_t *p;
  Vec_Ptr_t *vQueue;
  Nwk_Obj_t *pObj_00;
  Vec_Ptr_t *pVVar1;
  int iBox;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  Nwk_Obj_t *pObj_01;
  float fVar9;
  
  if ((*(uint *)&pObj->field_0x20 & 7) != 3) {
    __assert_fail("Nwk_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                  ,0x289,"void Nwk_NodeUpdateRequired(Nwk_Obj_t *)");
  }
  p = pObj->pMan->pManTime;
  vQueue = pObj->pMan->vTemp;
  fVar9 = Nwk_NodeComputeRequired(pObj,1);
  if ((fVar9 + 0.01 <= pObj->tRequired) || (pObj->tRequired + 0.01 <= fVar9)) {
    __assert_fail("Nwk_ManTimeEqual( tRequired, Nwk_ObjRequired(pObj), (float)0.01 )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                  ,0x28c,"void Nwk_NodeUpdateRequired(Nwk_Obj_t *)");
  }
  vQueue->nSize = 0;
  if (pObj->nFanins < 1) {
LAB_0049aab2:
    pObj_01 = (Nwk_Obj_t *)0x0;
  }
  else {
    lVar5 = 0;
    do {
      pObj_01 = pObj->pFanio[lVar5];
      if (pObj_01 == (Nwk_Obj_t *)0x0) goto LAB_0049aab2;
      if ((pObj_01->field_0x20 & 0x10) == 0) {
        Nwk_NodeUpdateAddToQueue(vQueue,pObj_01,-1,0);
        pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pObj->nFanins);
  }
  if (p != (Tim_Man_t *)0x0) {
    Tim_ManIncrementTravId(p);
  }
  if (0 < vQueue->nSize) {
    lVar5 = 0;
    do {
      pObj_00 = (Nwk_Obj_t *)vQueue->pArray[lVar5];
      *(uint *)&pObj_00->field_0x20 = *(uint *)&pObj_00->field_0x20 & 0xffffffef;
      fVar9 = Nwk_NodeComputeRequired(pObj_00,1);
      if ((p != (Tim_Man_t *)0x0) && ((*(uint *)&pObj_00->field_0x20 & 7) == 2)) {
        fVar9 = Tim_ManGetCoRequired(p,*(uint *)&pObj_00->field_0x20 >> 7);
      }
      if ((fVar9 + 0.01 <= pObj_00->tRequired) || (pObj_00->tRequired + 0.01 <= fVar9)) {
        pObj_00->tRequired = fVar9;
        if ((*(uint *)&pObj_00->field_0x20 & 7) == 1) {
          if ((p != (Tim_Man_t *)0x0) &&
             (iBox = Tim_ManBoxForCi(p,*(uint *)&pObj_00->field_0x20 >> 7), -1 < iBox)) {
            iVar2 = Tim_ManIsCiTravIdCurrent(p,*(uint *)&pObj_00->field_0x20 >> 7);
            if (iVar2 != 0) {
              Tim_ManSetPreviousTravIdBoxOutputs(p,iBox);
            }
            Tim_ManSetCiRequired(p,*(uint *)&pObj_00->field_0x20 >> 7,fVar9);
            Tim_ManSetCurrentTravIdBoxOutputs(p,iBox);
            uVar3 = Tim_ManBoxInputFirst(p,iBox);
            uVar4 = Tim_ManBoxInputNum(p,iBox);
            if (0 < (int)uVar4) {
              uVar6 = (ulong)uVar3;
              uVar8 = (ulong)uVar4;
              do {
                if (((int)uVar3 < 0) || (pVVar1 = pObj_01->pMan->vCos, pVVar1->nSize <= (int)uVar6))
                {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                pObj_01 = (Nwk_Obj_t *)pVVar1->pArray[uVar6];
                if ((pObj_01->field_0x20 & 0x10) == 0) {
                  Nwk_NodeUpdateAddToQueue(vQueue,pObj_01,(int)lVar5,0);
                  pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
                }
                uVar6 = uVar6 + 1;
                uVar8 = uVar8 - 1;
              } while (uVar8 != 0);
            }
          }
        }
        else if (0 < pObj_00->nFanins) {
          lVar7 = 0;
          do {
            pObj_01 = pObj_00->pFanio[lVar7];
            if (pObj_01 == (Nwk_Obj_t *)0x0) {
              pObj_01 = (Nwk_Obj_t *)0x0;
              break;
            }
            if ((pObj_01->field_0x20 & 0x10) == 0) {
              Nwk_NodeUpdateAddToQueue(vQueue,pObj_01,(int)lVar5,0);
              pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < pObj_00->nFanins);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < vQueue->nSize);
  }
  return;
}

Assistant:

void Nwk_NodeUpdateRequired( Nwk_Obj_t * pObj )
{
    Tim_Man_t * pManTime = pObj->pMan->pManTime;
    Vec_Ptr_t * vQueue = pObj->pMan->vTemp;
    Nwk_Obj_t * pTemp;
    Nwk_Obj_t * pNext = NULL; // Suppress "might be used uninitialized"
    float tRequired;
    int iCur, k, iBox, iTerm1, nTerms;
    assert( Nwk_ObjIsNode(pObj) );
    // make sure the node's required time remained the same
    tRequired = Nwk_NodeComputeRequired( pObj, 1 );
    assert( Nwk_ManTimeEqual( tRequired, Nwk_ObjRequired(pObj), (float)0.01 ) );
    // initialize the queue with the node's faninsa and the old node's fanins
    Vec_PtrClear( vQueue );
    Nwk_ObjForEachFanin( pObj, pNext, k )
    {
        if ( pNext->MarkA )
            continue;
        Nwk_NodeUpdateAddToQueue( vQueue, pNext, -1, 0 );
        pNext->MarkA = 1;
    }
    // process objects
    if ( pManTime )
        Tim_ManIncrementTravId( pManTime );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vQueue, pTemp, iCur )
    {
        pTemp->MarkA = 0;
        tRequired = Nwk_NodeComputeRequired( pTemp, 1 );
        if ( Nwk_ObjIsCo(pTemp) && pManTime )
            tRequired = Tim_ManGetCoRequired( pManTime, pTemp->PioId );
        if ( Nwk_ManTimeEqual( tRequired, Nwk_ObjRequired(pTemp), (float)0.01 ) )
            continue;
        Nwk_ObjSetRequired( pTemp, tRequired );
        // add the fanins to the queue
        if ( Nwk_ObjIsCi(pTemp) )
        {
            if ( pManTime )
            {
                iBox = Tim_ManBoxForCi( pManTime, pTemp->PioId );
                if ( iBox >= 0 ) // this CI is an output of the box
                {
                    // it may happen that a box-output (CI) was already marked as visited
                    // when some other box-output of the same box was visited - here we undo this
                    if ( Tim_ManIsCiTravIdCurrent( pManTime, pTemp->PioId ) )
                        Tim_ManSetPreviousTravIdBoxOutputs( pManTime, iBox );
                    Tim_ManSetCiRequired( pManTime, pTemp->PioId, tRequired );
                    Tim_ManSetCurrentTravIdBoxOutputs( pManTime, iBox );
                    iTerm1 = Tim_ManBoxInputFirst( pManTime, iBox );
                    nTerms = Tim_ManBoxInputNum( pManTime, iBox );
                    for ( k = 0; k < nTerms; k++ )
                    {
                        pNext = Nwk_ManCo(pNext->pMan, iTerm1 + k);
                        if ( pNext->MarkA )
                            continue;
                        Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 0 );
                        pNext->MarkA = 1;
                    }
                }
            }
        }
        else
        {
            Nwk_ObjForEachFanin( pTemp, pNext, k )
            {
                if ( pNext->MarkA )
                    continue;
                Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 0 );
                pNext->MarkA = 1;
            }
        }
    }
}